

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O0

void __thiscall MetaDCEGraph::scanWebAssembly(MetaDCEGraph *this)

{
  Module *this_00;
  Name name_00;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *pvVar1;
  bool bVar2;
  pointer pEVar3;
  mapped_type *this_01;
  mapped_type *pmVar4;
  anon_class_16_2_51b3ad0a visitor;
  anon_class_16_2_6cd5bbc8 visitor_00;
  Name NVar5;
  Scanner local_470;
  PassRunner local_338 [8];
  PassRunner runner;
  Name local_228;
  undefined1 local_218 [8];
  InitScanner rooter;
  string_view local_110;
  Module *local_100;
  mapped_type *node;
  size_t sStack_f0;
  DCENode local_e0;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 auStack_60 [8];
  Name dceName;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_48;
  __node_base local_40;
  Name *name;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  MetaDCEGraph *this_local;
  
  wasm::ModuleUtils::
  iterModuleItems<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::ModuleItemKind,wasm::Named*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  this_00 = this->wasm;
  __end1 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&this_00->exports);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end(&this_00->exports);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                     *)&exp), bVar2) {
    name = (Name *)__gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                   ::operator*(&__end1);
    pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                       ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)name);
    local_40._M_nxt = (_Hash_node_base *)wasm::Export::getInternalName(pEVar3);
    if ((IString *)local_40._M_nxt != (IString *)0x0) {
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)name);
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           ::find(&this->exportToDCENode,(key_type *)pEVar3);
      dceName.super_IString.str._M_str =
           (char *)std::
                   unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::end(&this->exportToDCENode);
      bVar2 = std::__detail::operator==
                        (&local_48,
                         (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> *)
                         &dceName.super_IString.str._M_str);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"export",&local_81);
        pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)name);
        wasm::IString::toString_abi_cxx11_(&local_b8,(IString *)pEVar3);
        NVar5 = getName(this,&local_80,&local_b8);
        dceName.super_IString.str._M_len = NVar5.super_IString.str._M_str;
        auStack_60 = NVar5.super_IString.str._M_len;
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)name);
        pmVar4 = std::
                 unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 ::operator[](&this->exportToDCENode,(key_type *)pEVar3);
        wasm::Name::operator=(pmVar4,(Name *)auStack_60);
        node = (mapped_type *)auStack_60;
        sStack_f0 = dceName.super_IString.str._M_len;
        name_00.super_IString.str._M_str = (char *)dceName.super_IString.str._M_len;
        name_00.super_IString.str._M_len = (size_t)auStack_60;
        DCENode::DCENode(&local_e0,name_00);
        this_01 = std::
                  unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
                  ::operator[](&this->nodes,(Name *)auStack_60);
        DCENode::operator=(this_01,&local_e0);
        DCENode::~DCENode(&local_e0);
      }
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)name);
      pmVar4 = std::
               unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[](&this->exportToDCENode,(key_type *)pEVar3);
      local_100 = (Module *)
                  std::
                  unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
                  ::operator[](&this->nodes,pmVar4);
      pvVar1 = &local_100->exports;
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)name);
      local_110 = (string_view)
                  getDCEName(this,*(ModuleItemKind *)(pEVar3 + 0x10),
                             (Name)*(string_view *)local_40._M_nxt);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &(pvVar1->
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&local_110);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end1);
  }
  rooter.parentDceName.super_IString.str._M_str = (char *)this;
  wasm::ModuleUtils::iterDefinedGlobals<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::Global*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  wasm::Name::Name(&local_228);
  NVar5.super_IString.str._M_str = local_228.super_IString.str._M_str;
  NVar5.super_IString.str._M_len = local_228.super_IString.str._M_len;
  scanWebAssembly()::InitScanner::InitScanner(MetaDCEGraph*,wasm::Name_
            ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)local_218,this,NVar5);
  wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::setModule
            ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)local_218,this->wasm);
  visitor.rooter = (InitScanner *)local_228.super_IString.str._M_str;
  visitor.this = (MetaDCEGraph *)local_218;
  wasm::ModuleUtils::
  iterActiveElementSegments<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::ElementSegment*)_1_>
            ((ModuleUtils *)this->wasm,(Module *)this,visitor);
  visitor_00.this = (MetaDCEGraph *)local_218;
  visitor_00.rooter = (InitScanner *)this;
  wasm::ModuleUtils::
  iterActiveDataSegments<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::DataSegment*)_1_>
            ((ModuleUtils *)this->wasm,(Module *)local_218,visitor_00);
  wasm::PassRunner::PassRunner(local_338,this->wasm);
  scanWebAssembly::Scanner::Scanner(&local_470,this);
  wasm::WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>::run
            (&local_470.
              super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
             ,local_338,this->wasm);
  scanWebAssembly::Scanner::~Scanner(&local_470);
  wasm::PassRunner::~PassRunner(local_338);
  scanWebAssembly::InitScanner::~InitScanner((InitScanner *)local_218);
  return;
}

Assistant:

void scanWebAssembly() {
    // Add an entry for everything we might need ahead of time, so parallel work
    // does not alter parent state, just adds to things pointed by it,
    // independently (each thread will add for one function, etc.)
    ModuleUtils::iterModuleItems(wasm, [&](ModuleItemKind kind, Named* item) {
      if (auto* import = wasm.getImportOrNull(kind, item->name)) {
        auto id = getImportId(import->module, import->base);
        if (importIdToDCENode.find(id) == importIdToDCENode.end()) {
          auto dceName = getName("importId", import->name.toString());
          importIdToDCENode[id] = dceName;
        }
        return;
      }
      auto dceName = getName(kindPrefixes[kind], item->name.toString());
      itemToDCENode[{kind, item->name}] = dceName;
      nodes[dceName] = DCENode(dceName);
    });
    for (auto& exp : wasm.exports) {
      // skip type exports
      // TODO: shall we keep track of type dependencies?
      if (auto* name = exp->getInternalName()) {
        if (exportToDCENode.find(exp->name) == exportToDCENode.end()) {
          auto dceName = getName("export", exp->name.toString());
          exportToDCENode[exp->name] = dceName;
          nodes[dceName] = DCENode(dceName);
        }
        // we can also link the export to the thing being exported
        auto& node = nodes[exportToDCENode[exp->name]];
        node.reaches.push_back(getDCEName(ModuleItemKind(exp->kind), *name));
      }
    }
    // Add initializer dependencies
    // if we provide a parent DCE name, that is who can reach what we see
    // if none is provided, then it is something we must root
    struct InitScanner : public PostWalker<InitScanner> {
      InitScanner(MetaDCEGraph* parent, Name parentDceName)
        : parent(parent), parentDceName(parentDceName) {}

      void visitGlobalGet(GlobalGet* curr) { handleGlobal(curr->name); }
      void visitGlobalSet(GlobalSet* curr) { handleGlobal(curr->name); }
      void visitRefFunc(RefFunc* curr) {
        assert(!parentDceName.isNull());
        parent->nodes[parentDceName].reaches.push_back(
          parent->getDCEName(ModuleItemKind::Function, curr->func));
      }

    private:
      MetaDCEGraph* parent;
      Name parentDceName;

      void handleGlobal(Name name) {
        Name dceName;
        if (!getModule()->getGlobal(name)->imported()) {
          // its a defined global
          dceName = parent->itemToDCENode[{ModuleItemKind::Global, name}];
        } else {
          // it's an import.
          dceName = parent->importIdToDCENode[parent->getImportId(
            ModuleItemKind::Global, name)];
        }
        if (parentDceName.isNull()) {
          parent->roots.insert(dceName);
        } else {
          parent->nodes[parentDceName].reaches.push_back(dceName);
        }
      }
    };
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      InitScanner scanner(
        this, itemToDCENode[{ModuleItemKind::Global, global->name}]);
      scanner.setModule(&wasm);
      scanner.walk(global->init);
    });
    // We can't remove active segments, so root them and what they use.
    // TODO: treat them as in a cycle with their parent memory/table
    InitScanner rooter(this, Name());
    rooter.setModule(&wasm);
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      // TODO: currently, all functions in the table are roots, but we
      //       should add an option to refine that
      ElementUtils::iterElementSegmentFunctionNames(
        segment, [&](Name name, Index) {
          roots.insert(getDCEName(ModuleItemKind::Function, name));
        });
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::ElementSegment, segment->name));
    });
    ModuleUtils::iterActiveDataSegments(wasm, [&](DataSegment* segment) {
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::DataSegment, segment->name));
    });

    // A parallel scanner for function bodies
    struct Scanner : public WalkerPass<
                       PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>>> {
      bool isFunctionParallel() override { return true; }

      Scanner(MetaDCEGraph* parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Scanner>(parent);
      }

      void visitExpression(Expression* curr) {
#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#define DELEGATE_FIELD_NAME_KIND(id, field, kind)                              \
  if (cast->field.is()) {                                                      \
    handle(kind, cast->field);                                                 \
  }

#include "wasm-delegations-fields.def"
      }

    private:
      MetaDCEGraph* parent;

      void handle(ModuleItemKind kind, Name name) {
        getCurrentFunctionDCENode().reaches.push_back(
          parent->getDCEName(kind, name));
      }

      DCENode& getCurrentFunctionDCENode() {
        return parent->nodes[parent->itemToDCENode[{ModuleItemKind::Function,
                                                    getFunction()->name}]];
      }
    };

    PassRunner runner(&wasm);
    Scanner(this).run(&runner, &wasm);
  }